

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.cpp
# Opt level: O3

int __thiscall CMDPACTION::GetIndofMostLikelyOutcome(CMDPACTION *this)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  uVar2 = (uint)((ulong)((long)(this->SuccsID).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(this->SuccsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  if (0 < (int)uVar2) {
    uVar1 = 0xffffffff;
    uVar3 = 0;
    dVar4 = 0.0;
    do {
      dVar5 = (double)(this->SuccsProb).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar3];
      if (dVar4 <= dVar5) {
        uVar1 = uVar3 & 0xffffffff;
      }
      dVar4 = (double)(-(ulong)(dVar5 < dVar4) & (ulong)dVar4 |
                      ~-(ulong)(dVar5 < dVar4) & (ulong)dVar5);
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
    return (int)uVar1;
  }
  return -1;
}

Assistant:

int CMDPACTION::GetIndofMostLikelyOutcome()
{
    double HighestProb = 0;
    int mlind = -1;

    for (int oind = 0; oind < (int)this->SuccsID.size(); oind++) {
        if (this->SuccsProb[oind] >= HighestProb) {
            mlind = oind;
            HighestProb = this->SuccsProb[oind];
        }
    }

    return mlind;
}